

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlC14NDocSave(void)

{
  int iVar1;
  int iVar2;
  int val;
  int val_00;
  int val_01;
  xmlDocPtr val_02;
  xmlNodeSetPtr val_03;
  char *val_04;
  int local_6c;
  int n_compression;
  int compression;
  int n_filename;
  char *filename;
  int n_with_comments;
  int with_comments;
  int n_inclusive_ns_prefixes;
  xmlChar **inclusive_ns_prefixes;
  int n_mode;
  int mode;
  int n_nodes;
  xmlNodeSetPtr nodes;
  int n_doc;
  xmlDocPtr doc;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (nodes._4_4_ = 0; (int)nodes._4_4_ < 4; nodes._4_4_ = nodes._4_4_ + 1) {
    for (n_mode = 0; n_mode < 1; n_mode = n_mode + 1) {
      for (inclusive_ns_prefixes._4_4_ = 0; (int)inclusive_ns_prefixes._4_4_ < 4;
          inclusive_ns_prefixes._4_4_ = inclusive_ns_prefixes._4_4_ + 1) {
        for (n_with_comments = 0; n_with_comments < 1; n_with_comments = n_with_comments + 1) {
          for (filename._4_4_ = 0; (int)filename._4_4_ < 4; filename._4_4_ = filename._4_4_ + 1) {
            for (n_compression = 0; n_compression < 6; n_compression = n_compression + 1) {
              for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
                iVar1 = xmlMemBlocks();
                val_02 = gen_xmlDocPtr(nodes._4_4_,0);
                val_03 = gen_xmlNodeSetPtr(n_mode,1);
                iVar2 = gen_int(inclusive_ns_prefixes._4_4_,2);
                val = gen_int(filename._4_4_,4);
                val_04 = gen_fileoutput(n_compression,5);
                val_00 = gen_int(local_6c,6);
                val_01 = xmlC14NDocSave(val_02,val_03,iVar2,0,val,val_04,val_00);
                desret_int(val_01);
                call_tests = call_tests + 1;
                des_xmlDocPtr(nodes._4_4_,val_02,0);
                des_xmlNodeSetPtr(n_mode,val_03,1);
                des_int(inclusive_ns_prefixes._4_4_,iVar2,2);
                des_int(filename._4_4_,val,4);
                des_fileoutput(n_compression,val_04,5);
                des_int(local_6c,val_00,6);
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlC14NDocSave",(ulong)(uint)(iVar2 - iVar1));
                  ret_val = ret_val + 1;
                  printf(" %d",(ulong)nodes._4_4_);
                  printf(" %d",(ulong)(uint)n_mode);
                  printf(" %d",(ulong)inclusive_ns_prefixes._4_4_);
                  printf(" %d",(ulong)(uint)n_with_comments);
                  printf(" %d",(ulong)filename._4_4_);
                  printf(" %d",(ulong)(uint)n_compression);
                  printf(" %d");
                  printf("\n");
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlC14NDocSave(void) {
    int test_ret = 0;

#if defined(LIBXML_C14N_ENABLED)
    int mem_base;
    int ret_val;
    xmlDocPtr doc; /* the XML document for canonization */
    int n_doc;
    xmlNodeSetPtr nodes; /* the nodes set to be included in the canonized image or NULL if all document nodes should be included */
    int n_nodes;
    int mode; /* the c14n mode (see @xmlC14NMode) */
    int n_mode;
    xmlChar ** inclusive_ns_prefixes; /* the list of inclusive namespace prefixes ended with a NULL or NULL if there is no inclusive namespaces (only for exclusive canonicalization, ignored otherwise) */
    int n_inclusive_ns_prefixes;
    int with_comments; /* include comments in the result (!=0) or not (==0) */
    int n_with_comments;
    const char * filename; /* the filename to store canonical XML image */
    int n_filename;
    int compression; /* the compression level (zlib required): -1 - libxml default, 0 - uncompressed, >0 - compression level */
    int n_compression;

    for (n_doc = 0;n_doc < gen_nb_xmlDocPtr;n_doc++) {
    for (n_nodes = 0;n_nodes < gen_nb_xmlNodeSetPtr;n_nodes++) {
    for (n_mode = 0;n_mode < gen_nb_int;n_mode++) {
    for (n_inclusive_ns_prefixes = 0;n_inclusive_ns_prefixes < gen_nb_xmlChar_ptr_ptr;n_inclusive_ns_prefixes++) {
    for (n_with_comments = 0;n_with_comments < gen_nb_int;n_with_comments++) {
    for (n_filename = 0;n_filename < gen_nb_fileoutput;n_filename++) {
    for (n_compression = 0;n_compression < gen_nb_int;n_compression++) {
        mem_base = xmlMemBlocks();
        doc = gen_xmlDocPtr(n_doc, 0);
        nodes = gen_xmlNodeSetPtr(n_nodes, 1);
        mode = gen_int(n_mode, 2);
        inclusive_ns_prefixes = gen_xmlChar_ptr_ptr(n_inclusive_ns_prefixes, 3);
        with_comments = gen_int(n_with_comments, 4);
        filename = gen_fileoutput(n_filename, 5);
        compression = gen_int(n_compression, 6);

        ret_val = xmlC14NDocSave(doc, nodes, mode, inclusive_ns_prefixes, with_comments, filename, compression);
        desret_int(ret_val);
        call_tests++;
        des_xmlDocPtr(n_doc, doc, 0);
        des_xmlNodeSetPtr(n_nodes, nodes, 1);
        des_int(n_mode, mode, 2);
        des_xmlChar_ptr_ptr(n_inclusive_ns_prefixes, inclusive_ns_prefixes, 3);
        des_int(n_with_comments, with_comments, 4);
        des_fileoutput(n_filename, filename, 5);
        des_int(n_compression, compression, 6);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlC14NDocSave",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_nodes);
            printf(" %d", n_mode);
            printf(" %d", n_inclusive_ns_prefixes);
            printf(" %d", n_with_comments);
            printf(" %d", n_filename);
            printf(" %d", n_compression);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}